

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

string * __thiscall
helics::apps::RegexMatcher::generateMatch_abi_cxx11_(RegexMatcher *this,string_view testString)

{
  __const_iterator __i2;
  bool bVar1;
  int iVar2;
  __const_iterator __i1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long in_RSI;
  string *in_RDI;
  size_type endloc;
  size_type keyloc;
  size_t ii;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> matchResults;
  string *matcher;
  undefined7 in_stack_fffffffffffffed8;
  char in_stack_fffffffffffffedf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  const_reference in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  size_type in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  string *this_01;
  size_type local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string_view<char,_std::char_traits<char>_> local_4e [3];
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  this_01 = in_RDI;
  CLI::std::__cxx11::
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
  match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 *)in_stack_fffffffffffffee0);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_18);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::end(&local_18);
  bVar1 = std::
          regex_match<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>>
                    ((char *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
                     (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      *)in_stack_fffffffffffffee0,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),0);
  if (bVar1) {
    local_4e[0]._M_len._1_1_ = 0;
    __i1._M_current = (char *)(in_RSI + 0x48);
    __t = local_4e;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (this_01,__t,(allocator<char> *)__i1._M_current);
    std::allocator<char>::~allocator((allocator<char> *)local_4e);
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __i1._M_current,CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                    in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    if (iVar2 == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8,
                 (size_type)in_stack_fffffffffffffee0);
      local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      while (this_00 = local_58,
            pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CLI::std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(in_RSI + 0x20)), this_00 < pbVar3) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RSI + 0x20),(size_type)local_58);
        local_60 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                             (this_00,in_stack_fffffffffffffef8,(size_type)in_stack_fffffffffffffef0
                             );
        while (local_60 != 0xffffffffffffffff) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_of(in_stack_fffffffffffffee0,in_stack_fffffffffffffedf,0x20166b);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffee8,(difference_type)in_stack_fffffffffffffee0);
          in_stack_fffffffffffffef0 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator-((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffee8,(difference_type)in_stack_fffffffffffffee0);
          __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffee0,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffee8,(difference_type)in_stack_fffffffffffffee0);
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffee8,(difference_type)in_stack_fffffffffffffee0);
          __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffee0,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
          in_stack_fffffffffffffef8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CLI::std::__cxx11::
               match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
          in_stack_fffffffffffffee0 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((pair<const_char_*,_const_char_*> *)&in_stack_fffffffffffffef8->_M_dataplus)->first;
          in_stack_fffffffffffffee8 =
               CLI::std::__cxx11::
               match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
          __i2._M_current._4_4_ = iVar2;
          __i2._M_current._0_4_ = in_stack_ffffffffffffff08;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          replace(this_00,__i1,__i2,(char *)in_stack_fffffffffffffef8,
                  (char *)in_stack_fffffffffffffef0);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RSI + 0x20),(size_type)local_58);
          local_60 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                               (this_00,in_stack_fffffffffffffef8,
                                (size_type)in_stack_fffffffffffffef0);
        }
        local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(local_58->_M_dataplus)._M_p + 1);
      }
    }
    local_4e[0]._M_len._1_1_ = 1;
  }
  else {
    std::__cxx11::string::string(in_stack_fffffffffffffef0);
  }
  CLI::std::__cxx11::
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
  ~match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  *)0x20189e);
  return in_RDI;
}

Assistant:

std::string generateMatch(std::string_view testString)
    {
        std::match_results<typename decltype(testString)::const_iterator> matchResults{};
        if (std::regex_match(testString.begin(), testString.end(), matchResults, rmatch)) {
            std::string matcher(interface2);
            if (matcher.compare(0, 6, "REGEX:") == 0) {
                matcher.erase(0, 6);
                for (std::size_t ii = 0; ii < keys.size(); ++ii) {
                    auto keyloc = matcher.find(keys[ii]);
                    while (keyloc != std::string::npos) {
                        auto endloc = matcher.find_first_of(')', keyloc);
                        matcher.replace(matcher.begin() + keyloc - 1,
                                        matcher.begin() + endloc + 1,
                                        matchResults[ii + 1].first,
                                        matchResults[ii + 1].second);
                        keyloc = matcher.find(keys[ii]);
                    }
                }
            }

            return matcher;
        }
        return {};
    }